

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

char * __thiscall QLatin1::convertFromUnicode(QLatin1 *this,char *out,QStringView in,State *state)

{
  storage_type_conflict *psVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  ushort uVar7;
  
  uVar3 = *(uint *)in.m_data;
  pcVar4 = (char *)0x0;
  bVar6 = 0;
  if ((uVar3 & 2) == 0) {
    bVar6 = 0x3f;
  }
  if ((uVar3 & 1) != 0) {
    bVar6 = 0x3f;
  }
  if ((long)out < 1) {
    out = pcVar4;
  }
  for (pcVar5 = (char *)0x0; out != pcVar5; pcVar5 = pcVar5 + 1) {
    uVar2 = *(ushort *)(in.m_size + (long)pcVar5 * 2);
    uVar7 = uVar2;
    if (0xff < uVar2) {
      uVar7 = (ushort)bVar6;
    }
    pcVar4 = pcVar4 + (0xff < uVar2);
    this[(long)pcVar5] = SUB21(uVar7,0);
  }
  if ((uVar3 & 1) == 0) {
    psVar1 = in.m_data + 8;
    *(char **)psVar1 = pcVar4 + *(long *)psVar1;
  }
  return (char *)(this + (long)pcVar5);
}

Assistant:

char *QLatin1::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state) noexcept
{
    Q_ASSERT(state);
    if (state->flags & QStringConverter::Flag::Stateless) // temporary
        state = nullptr;

    const char replacement = (state && state->flags & QStringConverter::Flag::ConvertInvalidToNull) ? 0 : '?';
    qsizetype invalid = 0;
    for (qsizetype i = 0; i < in.size(); ++i) {
        if (in[i] > QChar(0xff)) {
            *out = replacement;
            ++invalid;
        } else {
            *out = (char)in[i].cell();
        }
        ++out;
    }
    if (state)
        state->invalidChars += invalid;
    return out;
}